

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d64_q1b_moving_median.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  iterator __position;
  ulong uVar4;
  size_t i_1;
  ulong uVar5;
  size_t i;
  long lVar6;
  bool bVar7;
  size_t w;
  size_t n;
  vector<int,_std::allocator<int>_> v;
  multiset<int,_std::less<int>,_std::allocator<int>_> s;
  ulong local_88;
  size_type local_80;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  lVar6 = 0;
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105190) = 0;
  piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)&std::cin);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_78,local_80,(allocator_type *)&local_60);
  for (uVar5 = 0; uVar5 < local_80; uVar5 = uVar5 + 1) {
    std::istream::operator>>
              ((istream *)&std::cin,
               (int *)((long)local_78._M_impl.super__Vector_impl_data._M_start + lVar6));
    lVar6 = lVar6 + 4;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar6 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar5 = 0; uVar5 < local_88 + 1; uVar5 = uVar5 + 1) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_equal<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_60
               ,(int *)((long)local_78._M_impl.super__Vector_impl_data._M_start + lVar6));
    lVar6 = lVar6 + 4;
  }
  uVar5 = local_88 >> 1;
  p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  for (uVar5 = 0; uVar5 < local_80 - local_88; uVar5 = uVar5 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p_Var2[1]._M_color);
    std::operator<<(poVar3," ");
    __position = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                 ::find(&local_60,local_78._M_impl.super__Vector_impl_data._M_start + uVar5);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::erase_abi_cxx11_
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_60
               ,(const_iterator)__position._M_node);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_equal<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_60
               ,local_78._M_impl.super__Vector_impl_data._M_start + uVar5 + local_88 + 1);
    uVar4 = local_88 >> 1;
    p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    size_t n,w;
    cin >> n >> w;
    vector<int> v(n);
    for (size_t i = 0; i < n; ++i) {
        cin >> v[i];
    }
    multiset<int> s;
    for (size_t i = 0; i < w+1; ++i) {
        s.insert(v[i]);
    }
    auto it = s.begin();
    for (size_t i = 0; i < w/2; ++i) {
        ++it;
    }
    for (size_t i = 0; i < n-w; ++i) {
        cout << *it << " ";
        auto tmp = s.find(v[i]);
        s.erase(tmp);
        s.insert(v[i+w+1]);
        it = s.begin();
        for (size_t i = 0; i < w/2; ++i) {
            ++it;
        }
    }
    cout << endl;
}